

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_taproot.cpp
# Opt level: O1

vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> * __thiscall
cfd::core::TapBranch::GetNodeList
          (vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
           *__return_storage_ptr__,TapBranch *this)

{
  TapBranch *pTVar1;
  TapBranch *this_00;
  ByteData256 local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pTVar1 = (this->branch_list_).
           super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (this_00 = (this->branch_list_).
                 super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>.
                 _M_impl.super__Vector_impl_data._M_start; this_00 != pTVar1; this_00 = this_00 + 1)
  {
    GetBranchHash(&local_38,this_00,
                  (char)((uint)(*(int *)&(this_00->branch_list_).
                                         super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                               *(int *)&(this_00->branch_list_).
                                        super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x11);
    ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::
    emplace_back<cfd::core::ByteData256>(__return_storage_ptr__,&local_38);
    if (local_38.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_38.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<ByteData256> TapBranch::GetNodeList() const {
  std::vector<ByteData256> list;
  for (const auto& branch : branch_list_) {
    list.emplace_back(branch.GetCurrentBranchHash());
  }
  return list;
}